

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderSingle.h
# Opt level: O0

void __thiscall
FIX41::NewOrderSingle::NewOrderSingle
          (NewOrderSingle *this,ClOrdID *aClOrdID,HandlInst *aHandlInst,Symbol *aSymbol,Side *aSide,
          OrdType *aOrdType)

{
  MsgType local_90;
  OrdType *local_38;
  OrdType *aOrdType_local;
  Side *aSide_local;
  Symbol *aSymbol_local;
  HandlInst *aHandlInst_local;
  ClOrdID *aClOrdID_local;
  NewOrderSingle *this_local;
  
  local_38 = aOrdType;
  aOrdType_local = (OrdType *)aSide;
  aSide_local = (Side *)aSymbol;
  aSymbol_local = (Symbol *)aHandlInst;
  aHandlInst_local = (HandlInst *)aClOrdID;
  aClOrdID_local = (ClOrdID *)this;
  MsgType();
  FIX41::Message::Message(&this->super_Message,&local_90);
  FIX::MsgType::~MsgType(&local_90);
  *(undefined ***)&this->super_Message = &PTR__NewOrderSingle_00189ef0;
  set(this,(ClOrdID *)aHandlInst_local);
  set(this,(HandlInst *)aSymbol_local);
  set(this,(Symbol *)aSide_local);
  set(this,(Side *)aOrdType_local);
  set(this,local_38);
  return;
}

Assistant:

NewOrderSingle(
      const FIX::ClOrdID& aClOrdID,
      const FIX::HandlInst& aHandlInst,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::OrdType& aOrdType )
    : Message(MsgType())
    {
      set(aClOrdID);
      set(aHandlInst);
      set(aSymbol);
      set(aSide);
      set(aOrdType);
    }